

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O1

void C_DeinitConsole(void)

{
  GameAtExit *pGVar1;
  History *pHVar2;
  FBaseCVar *pFVar3;
  FConsoleCommand *pFVar4;
  History *pHVar5;
  FConsoleCommand *pFVar6;
  FConsoleBuffer *this;
  FBaseCVar *pFVar7;
  int iVar8;
  char *cmd;
  GameAtExit *pGVar9;
  FBaseCVar **ppFVar10;
  size_t i;
  long lVar11;
  
  pGVar9 = ExitCmdList;
  pHVar5 = HistTail;
  if (ExitCmdList != (GameAtExit *)0x0) {
    do {
      pGVar1 = pGVar9->Next;
      cmd = FString::LockBuffer(&pGVar9->Command);
      AddCommandString(cmd,0);
      FString::~FString(&pGVar9->Command);
      operator_delete(pGVar9,0x10);
      pGVar9 = pGVar1;
      pHVar5 = HistTail;
    } while (pGVar1 != (GameAtExit *)0x0);
  }
  while (pHVar5 != (History *)0x0) {
    pHVar2 = pHVar5->Newer;
    FString::~FString(&pHVar5->String);
    operator_delete(pHVar5,0x18);
    pHVar5 = pHVar2;
  }
  HistPos = (History *)0x0;
  HistHead = (History *)0x0;
  HistTail = (History *)0x0;
  ppFVar10 = &CVars;
  pFVar7 = CVars;
  while (pFVar7 != (FBaseCVar *)0x0) {
    pFVar3 = pFVar7->m_Next;
    if ((pFVar7->Flags & 0x20) == 0) {
      ppFVar10 = &pFVar7->m_Next;
      pFVar7 = pFVar3;
    }
    else {
      (*pFVar7->_vptr_FBaseCVar[1])();
      *ppFVar10 = pFVar3;
      pFVar7 = pFVar3;
    }
  }
  lVar11 = 0;
  do {
    pFVar4 = Commands[lVar11];
    this = conbuffer;
    while (pFVar6 = pFVar4, conbuffer = this, pFVar6 != (FConsoleCommand *)0x0) {
      pFVar4 = pFVar6->m_Next;
      iVar8 = (*pFVar6->_vptr_FConsoleCommand[2])(pFVar6);
      this = conbuffer;
      if ((char)iVar8 != '\0') {
        (*pFVar6->_vptr_FConsoleCommand[1])(pFVar6);
        this = conbuffer;
      }
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0xfb);
  if (TabCommands.Count != 0) {
    TabCommands.Count = 0;
  }
  if (this != (FConsoleBuffer *)0x0) {
    FConsoleBuffer::~FConsoleBuffer(this);
    operator_delete(this,0x68);
    conbuffer = (FConsoleBuffer *)0x0;
  }
  return;
}

Assistant:

void C_DeinitConsole ()
{
	GameAtExit *cmd = ExitCmdList;

	while (cmd != NULL)
	{
		GameAtExit *next = cmd->Next;
		AddCommandString (cmd->Command.LockBuffer());
		delete cmd;
		cmd = next;
	}

	// Free command history
	History *hist = HistTail;

	while (hist != NULL)
	{
		History *next = hist->Newer;
		delete hist;
		hist = next;
	}
	HistTail = HistHead = HistPos = NULL;

	// Free cvars allocated at runtime
	FBaseCVar *var, *next, **nextp;
	for (var = CVars, nextp = &CVars; var != NULL; var = next)
	{
		next = var->m_Next;
		if (var->GetFlags() & CVAR_UNSETTABLE)
		{
			delete var;
			*nextp = next;
		}
		else
		{
			nextp = &var->m_Next;
		}
	}

	// Free alias commands. (i.e. The "commands" that can be allocated
	// at runtime.)
	for (size_t i = 0; i < countof(Commands); ++i)
	{
		FConsoleCommand *cmd = Commands[i];

		while (cmd != NULL)
		{
			FConsoleCommand *next = cmd->m_Next;
			if (cmd->IsAlias())
			{
				delete cmd;
			}
			cmd = next;
		}
	}

	// Make sure all tab commands are cleared before the memory for
	// their names is deallocated.
	C_ClearTabCommands ();

	// Free AddToConsole()'s work buffer
	if (work != NULL)
	{
		free (work);
		work = NULL;
		worklen = 0;
	}

	if (conbuffer != NULL)
	{
		delete conbuffer;
		conbuffer = NULL;
	}
}